

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiKeyRoutingData * ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)

{
  short sVar1;
  ImGuiKeyRoutingData *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiKeyRoutingData *pIVar4;
  long lVar5;
  ImGuiKey key;
  ImGuiKey IVar6;
  ImGuiKeyRoutingData *pIVar7;
  ImGuiKeyRoutingData local_30;
  
  pIVar3 = GImGui;
  key = key_chord & ImGuiMod_Mask_;
  IVar6 = key_chord & ~ImGuiMod_Mask_;
  if (IVar6 == ImGuiKey_KeysData_OFFSET) {
    IVar6 = ConvertSingleModFlagToKey(key);
  }
  pIVar7 = (ImGuiKeyRoutingData *)
           (&pIVar3->KeysOwnerData[0x36].LockThisFrame + (long)(int)IVar6 * 2);
  pIVar4 = pIVar7;
  do {
    lVar5 = (long)pIVar4->NextEntryIndex;
    if (lVar5 == -1) {
      sVar1 = (short)(pIVar3->KeysRoutingTable).Entries.Size;
      local_30.NextEntryIndex = -1;
      local_30.Mods = 0;
      local_30.RoutingNextScore = 0xff;
      local_30.RoutingCurr = 0xffffffff;
      local_30.RoutingNext = 0xffffffff;
      ImVector<ImGuiKeyRoutingData>::push_back(&(pIVar3->KeysRoutingTable).Entries,&local_30);
      pIVar4 = (pIVar3->KeysRoutingTable).Entries.Data;
      pIVar4[sVar1].Mods = (ImU16)key;
      pIVar4[sVar1].NextEntryIndex = pIVar7->NextEntryIndex;
      pIVar7->NextEntryIndex = sVar1;
      return pIVar4 + sVar1;
    }
    pIVar2 = (pIVar3->KeysRoutingTable).Entries.Data;
    pIVar4 = pIVar2 + lVar5;
  } while (key != pIVar2[lVar5].Mods);
  return pIVar4;
}

Assistant:

ImGuiKeyRoutingData* ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)
{
    // Majority of shortcuts will be Key + any number of Mods
    // We accept _Single_ mod with ImGuiKey_None.
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl);                    // Legal
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl | ImGuiMod_Shift);   // Legal
    //  - Shortcut(ImGuiMod_Ctrl);                                 // Legal
    //  - Shortcut(ImGuiMod_Ctrl | ImGuiMod_Shift);                // Not legal
    ImGuiContext& g = *GImGui;
    ImGuiKeyRoutingTable* rt = &g.KeysRoutingTable;
    ImGuiKeyRoutingData* routing_data;
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);
    IM_ASSERT(IsNamedKey(key));

    // Get (in the majority of case, the linked list will have one element so this should be 2 reads.
    // Subsequent elements will be contiguous in memory as list is sorted/rebuilt in NewFrame).
    for (ImGuiKeyRoutingIndex idx = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; idx != -1; idx = routing_data->NextEntryIndex)
    {
        routing_data = &rt->Entries[idx];
        if (routing_data->Mods == mods)
            return routing_data;
    }

    // Add to linked-list
    ImGuiKeyRoutingIndex routing_data_idx = (ImGuiKeyRoutingIndex)rt->Entries.Size;
    rt->Entries.push_back(ImGuiKeyRoutingData());
    routing_data = &rt->Entries[routing_data_idx];
    routing_data->Mods = (ImU16)mods;
    routing_data->NextEntryIndex = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; // Setup linked list
    rt->Index[key - ImGuiKey_NamedKey_BEGIN] = routing_data_idx;
    return routing_data;
}